

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondJump.cpp
# Opt level: O2

void __thiscall OpenMD::HBondJumpR::postCorrelate(HBondJumpR *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  pointer pvVar4;
  uint i;
  ulong uVar5;
  pointer pvVar6;
  uint j;
  ulong uVar7;
  long lVar8;
  double dVar9;
  
  uVar1 = (this->super_HBondJump).super_TimeCorrFunc<double>.nTimeBins_;
  uVar2 = this->nRBins_;
  for (uVar5 = 0; uVar5 != uVar1; uVar5 = uVar5 + 1) {
    pvVar4 = (this->counts_).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar6 = (this->histogram_).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + uVar5;
    for (uVar7 = 0; uVar2 != uVar7; uVar7 = uVar7 + 1) {
      iVar3 = *(int *)(*(long *)&pvVar4[uVar5].super__Vector_base<int,_std::allocator<int>_>._M_impl
                                 .super__Vector_impl_data + uVar7 * 4);
      if (iVar3 < 1) {
        lVar8 = *(long *)&(pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data;
        *(undefined8 *)(lVar8 + uVar7 * 8) = 0;
        dVar9 = 0.0;
      }
      else {
        lVar8 = *(long *)&(pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data;
        dVar9 = *(double *)(lVar8 + uVar7 * 8) / (double)iVar3;
        *(double *)(lVar8 + uVar7 * 8) = dVar9;
      }
      *(double *)(lVar8 + uVar7 * 8) = 1.0 - dVar9;
    }
  }
  return;
}

Assistant:

void HBondJumpR::postCorrelate() {
    for (unsigned int i = 0; i < nTimeBins_; ++i) {
      for (unsigned int j = 0; j < nRBins_; ++j) {
        if (counts_[i][j] > 0) {
          histogram_[i][j] /= counts_[i][j];
        } else {
          histogram_[i][j] = 0;
        }
        histogram_[i][j] = 1.0 - histogram_[i][j];
      }
    }
  }